

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O1

void Image_Function::Transpose
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  EVP_PKEY_CTX *src;
  uchar *puVar4;
  ulong uVar5;
  uchar *puVar6;
  uchar *puVar7;
  ImageTemplate<unsigned_char> local_58;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,width,height);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (out,startXOut,startYOut,height,width);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011cc30;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011cc30;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  uVar1 = out->_rowSize;
  if (width * uVar1 != 0) {
    puVar3 = out->_data + (ulong)startXOut + (ulong)(startYOut * uVar1);
    puVar7 = puVar3 + width * uVar1;
    uVar2 = in->_rowSize;
    puVar4 = in->_data + (ulong)startXIn + (ulong)(startYIn * uVar2);
    do {
      if (height != 0) {
        uVar5 = 0;
        puVar6 = puVar4;
        do {
          puVar3[uVar5] = *puVar6;
          puVar6 = puVar6 + uVar2;
          uVar5 = uVar5 + 1;
        } while (height != uVar5);
      }
      puVar3 = puVar3 + uVar1;
      puVar4 = puVar4 + 1;
    } while (puVar3 != puVar7);
  }
  return;
}

Assistant:

void Transpose( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, width, height );
        ParameterValidation( out, startXOut, startYOut, height, width );
        VerifyGrayScaleImage( in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inX  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + width * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, ++inX ) {
            const uint8_t * inY  = inX;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + height;

            for( ; outX != outXEnd; ++outX, inY += rowSizeIn )
                (*outX) = *(inY);
        }
    }